

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_bin_ugrid_chunk(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT n,REF_INT *chunk)

{
  void *__ptr;
  size_t sVar1;
  undefined1 *puVar2;
  REF_INT *pRVar3;
  char *yp_1;
  char *xp_1;
  int y_1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  char *yp;
  char *xp;
  long y;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_LONG *actual;
  REF_INT i;
  REF_INT *chunk_local;
  REF_INT n_local;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  FILE *file_local;
  
  if (fat == 0) {
    sVar1 = fread(chunk,4,(long)n,(FILE *)file);
    if ((long)n != sVar1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1da,"ref_import_bin_ugrid_chunk","int chunk",(long)n,sVar1);
      return 1;
    }
    if (swap != 0) {
      for (actual._4_4_ = 0; actual._4_4_ < n; actual._4_4_ = actual._4_4_ + 1) {
        pRVar3 = chunk + actual._4_4_;
        xp_1._7_1_ = (char)*pRVar3;
        xp_1._6_1_ = *(undefined1 *)((long)pRVar3 + 1);
        xp_1._5_1_ = *(undefined1 *)((long)pRVar3 + 2);
        xp_1._4_1_ = *(undefined1 *)((long)pRVar3 + 3);
        chunk[actual._4_4_] = xp_1._4_4_;
      }
    }
  }
  else {
    if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1ce,"ref_import_bin_ugrid_chunk","malloc actual of REF_LONG negative");
      return 1;
    }
    __ptr = malloc((long)n << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1ce,"ref_import_bin_ugrid_chunk","malloc actual of REF_LONG NULL");
      return 2;
    }
    sVar1 = fread(__ptr,8,(long)n,(FILE *)file);
    if ((long)n != sVar1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1cf,"ref_import_bin_ugrid_chunk","long chunk",(long)n,sVar1);
      return 1;
    }
    if (swap != 0) {
      for (actual._4_4_ = 0; actual._4_4_ < n; actual._4_4_ = actual._4_4_ + 1) {
        puVar2 = (undefined1 *)((long)__ptr + (long)actual._4_4_ * 8);
        xp._7_1_ = *puVar2;
        xp._6_1_ = puVar2[1];
        xp._5_1_ = puVar2[2];
        xp._4_1_ = puVar2[3];
        xp._3_1_ = puVar2[4];
        xp._2_1_ = puVar2[5];
        xp._1_1_ = puVar2[6];
        xp._0_1_ = puVar2[7];
        *(char **)((long)__ptr + (long)actual._4_4_ * 8) = xp;
      }
    }
    for (actual._4_4_ = 0; actual._4_4_ < n; actual._4_4_ = actual._4_4_ + 1) {
      chunk[actual._4_4_] = (REF_INT)*(undefined8 *)((long)__ptr + (long)actual._4_4_ * 8);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_chunk(FILE *file, REF_BOOL swap,
                                                     REF_BOOL fat, REF_INT n,
                                                     REF_INT *chunk) {
  REF_INT i;
  if (fat) {
    REF_LONG *actual;
    ref_malloc(actual, n, REF_LONG);
    REIS(n, fread(actual, sizeof(REF_LONG), (size_t)(n), file), "long chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_LONG(actual[i]);
      }
    }
    for (i = 0; i < n; i++) {
      chunk[i] = (REF_INT)actual[i];
    }
    ref_free(actual);
  } else {
    REIS(n, fread(chunk, sizeof(REF_INT), (size_t)(n), file), "int chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_INT(chunk[i]);
      }
    }
  }

  return REF_SUCCESS;
}